

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::ScissorTestStateAPI::compareScissorTestStates
          (ScissorTestStateAPI *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *left,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *right,GLchar *description,
          bool *out_result)

{
  ostringstream *this_00;
  pointer puVar1;
  MessageBuilder *pMVar2;
  ulong uVar3;
  undefined1 local_1b0 [384];
  
  this_00 = (ostringstream *)(local_1b0 + 8);
  for (uVar3 = 0;
      puVar1 = (left->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(left->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
      uVar3 = uVar3 + 1) {
    if (puVar1[uVar3] !=
        (right->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar3]) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Test case: ");
      std::operator<<((ostream *)this_00,description);
      std::operator<<((ostream *)this_00," Invalid values [");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,"] ");
      pMVar2 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,
                          (left->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start + uVar3);
      std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ");
      pMVar2 = tcu::MessageBuilder::operator<<
                         (pMVar2,(right->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar3);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      *out_result = false;
    }
  }
  return;
}

Assistant:

void ScissorTestStateAPI::compareScissorTestStates(std::vector<GLboolean>& left, std::vector<GLboolean>& right,
												   const GLchar* description, bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;

			out_result = false;
		}
	}
}